

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O1

void ma_device__on_data(ma_device *pDevice,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  ma_uint32 *pmVar1;
  uint uVar2;
  ma_uint32 mVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  void *pvVar9;
  void *pvVar10;
  size_t sVar11;
  ulong uVar12;
  ulong uVar13;
  
  if ((pDevice == (ma_device *)0x0) || (pDevice->state != ma_device_state_stopping)) {
    if (pDevice->noFixedSizedCallback != '\0') {
      ma_device__on_data_inner(pDevice,pFramesOut,pFramesIn,frameCount);
      return;
    }
    if (frameCount != 0) {
      uVar12 = 0;
      do {
        uVar7 = frameCount - (int)uVar12;
        uVar6 = 0;
        if (pFramesIn != (void *)0x0) {
          uVar4 = (pDevice->capture).intermediaryBufferCap;
          uVar2 = (pDevice->capture).intermediaryBufferLen;
          uVar6 = 0;
          if (uVar2 < uVar4) {
            uVar4 = uVar4 - uVar2;
            if (uVar7 < uVar4) {
              uVar4 = uVar7;
            }
            uVar6 = (ulong)uVar4;
            uVar5 = (ulong)((&DAT_001bf4d0)[(pDevice->capture).format] * (pDevice->capture).channels
                           );
            uVar13 = uVar6 * uVar5;
            if (uVar13 != 0) {
              pvVar10 = (void *)(uVar2 * uVar5 + (long)(pDevice->capture).pIntermediaryBuffer);
              pvVar9 = (void *)(uVar12 * uVar5 + (long)pFramesIn);
              if (pvVar10 != pvVar9) {
                do {
                  sVar11 = 0xffffffff;
                  if (uVar13 < 0xffffffff) {
                    sVar11 = uVar13;
                  }
                  memcpy(pvVar10,pvVar9,sVar11);
                  pvVar10 = (void *)((long)pvVar10 + sVar11);
                  pvVar9 = (void *)((long)pvVar9 + sVar11);
                  uVar13 = uVar13 - sVar11;
                } while (uVar13 != 0);
              }
            }
            pmVar1 = &(pDevice->capture).intermediaryBufferLen;
            *pmVar1 = *pmVar1 + uVar4;
          }
          mVar3 = (pDevice->capture).intermediaryBufferCap;
          if (((pDevice->capture).intermediaryBufferLen == mVar3) &&
             (pDevice->type != ma_device_type_duplex)) {
            ma_device__on_data_inner
                      (pDevice,(void *)0x0,(pDevice->capture).pIntermediaryBuffer,mVar3);
            (pDevice->capture).intermediaryBufferLen = 0;
          }
        }
        if (pFramesOut == (void *)0x0) {
          iVar8 = (int)uVar6;
        }
        else {
          uVar4 = (pDevice->playback).intermediaryBufferLen;
          if (uVar4 != 0) {
            if (uVar4 <= uVar7) {
              uVar7 = uVar4;
            }
            uVar5 = (ulong)uVar7;
            if (pDevice->type == ma_device_type_duplex) {
              uVar5 = uVar6;
            }
            uVar6 = (ulong)((&DAT_001bf4d0)[(pDevice->playback).format] *
                           (pDevice->playback).channels);
            pvVar9 = (void *)(uVar12 * uVar6 + (long)pFramesOut);
            pvVar10 = (void *)(((pDevice->playback).intermediaryBufferCap - uVar4) * uVar6 +
                              (long)(pDevice->playback).pIntermediaryBuffer);
            if (pvVar9 != pvVar10) {
              for (uVar6 = uVar6 * uVar5; uVar6 != 0; uVar6 = uVar6 - sVar11) {
                sVar11 = 0xffffffff;
                if (uVar6 < 0xffffffff) {
                  sVar11 = uVar6;
                }
                memcpy(pvVar9,pvVar10,sVar11);
                pvVar9 = (void *)((long)pvVar9 + sVar11);
                pvVar10 = (void *)((long)pvVar10 + sVar11);
              }
            }
            pmVar1 = &(pDevice->playback).intermediaryBufferLen;
            *pmVar1 = *pmVar1 - (int)uVar5;
            uVar6 = uVar5;
          }
          iVar8 = (int)uVar6;
          if (((pDevice->playback).intermediaryBufferLen == 0) &&
             (pDevice->type != ma_device_type_duplex)) {
            ma_device__on_data_inner
                      (pDevice,(pDevice->playback).pIntermediaryBuffer,(void *)0x0,
                       (pDevice->playback).intermediaryBufferCap);
            (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          }
        }
        if ((pDevice->type == ma_device_type_duplex) &&
           (mVar3 = (pDevice->capture).intermediaryBufferCap,
           (pDevice->capture).intermediaryBufferLen == mVar3)) {
          ma_device__on_data_inner
                    (pDevice,(pDevice->playback).pIntermediaryBuffer,
                     (pDevice->capture).pIntermediaryBuffer,mVar3);
          (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          (pDevice->capture).intermediaryBufferLen = 0;
        }
        uVar7 = iVar8 + (int)uVar12;
        uVar12 = (ulong)uVar7;
      } while (uVar7 < frameCount);
    }
  }
  return;
}

Assistant:

static void ma_device__on_data(ma_device* pDevice, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    MA_ASSERT(pDevice != NULL);

    /* Don't read more data from the client if we're in the process of stopping. */
    if (ma_device_get_state(pDevice) == ma_device_state_stopping) {
        return;
    }

    if (pDevice->noFixedSizedCallback) {
        /* Fast path. Not using a fixed sized callback. Process directly from the specified buffers. */
        ma_device__on_data_inner(pDevice, pFramesOut, pFramesIn, frameCount);
    } else {
        /* Slow path. Using a fixed sized callback. Need to use the intermediary buffer. */
        ma_uint32 totalFramesProcessed = 0;

        while (totalFramesProcessed < frameCount) {
            ma_uint32 totalFramesRemaining = frameCount - totalFramesProcessed;
            ma_uint32 framesToProcessThisIteration = 0;

            if (pFramesIn != NULL) {
                /* Capturing. Write to the intermediary buffer. If there's no room, fire the callback to empty it. */
                if (pDevice->capture.intermediaryBufferLen < pDevice->capture.intermediaryBufferCap) {
                    /* There's some room left in the intermediary buffer. Write to it without firing the callback. */
                    framesToProcessThisIteration = totalFramesRemaining;
                    if (framesToProcessThisIteration > pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen) {
                        framesToProcessThisIteration = pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen;
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferLen, pDevice->capture.format, pDevice->capture.channels),
                        ma_offset_pcm_frames_const_ptr(pFramesIn, totalFramesProcessed, pDevice->capture.format, pDevice->capture.channels),
                        framesToProcessThisIteration,
                        pDevice->capture.format, pDevice->capture.channels);

                    pDevice->capture.intermediaryBufferLen += framesToProcessThisIteration;
                }

                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    /* No room left in the intermediary buffer. Fire the data callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* We'll do the duplex data callback later after we've processed the playback data. */
                    } else {
                        ma_device__on_data_inner(pDevice, NULL, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                        /* The intermediary buffer has just been drained. */
                        pDevice->capture.intermediaryBufferLen = 0;
                    }
                }
            }

            if (pFramesOut != NULL) {
                /* Playing back. Read from the intermediary buffer. If there's nothing in it, fire the callback to fill it. */
                if (pDevice->playback.intermediaryBufferLen > 0) {
                    /* There's some content in the intermediary buffer. Read from that without firing the callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* The frames processed this iteration for a duplex device will always be based on the capture side. Leave it unmodified. */
                    } else {
                        framesToProcessThisIteration = totalFramesRemaining;
                        if (framesToProcessThisIteration > pDevice->playback.intermediaryBufferLen) {
                            framesToProcessThisIteration = pDevice->playback.intermediaryBufferLen;
                        }
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pFramesOut, totalFramesProcessed, pDevice->playback.format, pDevice->playback.channels),
                        ma_offset_pcm_frames_ptr(pDevice->playback.pIntermediaryBuffer, pDevice->playback.intermediaryBufferCap - pDevice->playback.intermediaryBufferLen, pDevice->playback.format, pDevice->playback.channels),
                        framesToProcessThisIteration,
                        pDevice->playback.format, pDevice->playback.channels);

                    pDevice->playback.intermediaryBufferLen -= framesToProcessThisIteration;
                }

                if (pDevice->playback.intermediaryBufferLen == 0) {
                    /* There's nothing in the intermediary buffer. Fire the data callback to fill it. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* In duplex mode, the data callback will be fired later. Nothing to do here. */
                    } else {
                        ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, NULL, pDevice->playback.intermediaryBufferCap);

                        /* The intermediary buffer has just been filled. */
                        pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;
                    }
                }   
            }

            /* If we're in duplex mode we might need to do a refill of the data. */
            if (pDevice->type == ma_device_type_duplex) {
                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                    pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;  /* The playback buffer will have just been filled. */
                    pDevice->capture.intermediaryBufferLen  = 0;                                        /* The intermediary buffer has just been drained. */
                }
            }

            /* Make sure this is only incremented once in the duplex case. */
            totalFramesProcessed += framesToProcessThisIteration;
        }
    }
}